

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O1

void AM_doFollowPlayer(void)

{
  long *plVar1;
  double sy;
  double sx;
  double local_28;
  double local_20;
  DAngle local_18;
  
  if ((&DAT_017e5fc8)[(long)consoleplayer * 0x54] != 0) {
    plVar1 = &DAT_017e5fc8 + (long)consoleplayer * 0x54;
    if ((*(byte *)((&DAT_017e5fc8)[(long)consoleplayer * 0x54] + 0x20) & 0x20) == 0) {
      if ((_ZL8f_oldloc_0 == *(double *)(*plVar1 + 0x48)) &&
         (!NAN(_ZL8f_oldloc_0) && !NAN(*(double *)(*plVar1 + 0x48)))) {
        if ((_ZL8f_oldloc_1 == *(double *)(*plVar1 + 0x50)) &&
           (!NAN(_ZL8f_oldloc_1) && !NAN(*(double *)(*plVar1 + 0x50)))) {
          return;
        }
      }
      m_x = *(double *)(*plVar1 + 0x48) - m_w * 0.5;
      m_y = *(double *)(*plVar1 + 0x50) - m_h * 0.5;
      m_x2 = m_x + m_w;
      m_y2 = m_y + m_h;
      local_20 = *(double *)(*plVar1 + 0x48) - _ZL8f_oldloc_0;
      local_28 = _ZL8f_oldloc_1 - *(double *)(*plVar1 + 0x50);
      if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive)))) {
        local_18.Degrees = *(double *)(*plVar1 + 0xb0) + -90.0;
        AM_rotate(&local_20,&local_28,&local_18);
      }
      AM_ScrollParchment(local_20,local_28);
      _ZL8f_oldloc_0 = *(double *)((&DAT_017e5fc8)[(long)consoleplayer * 0x54] + 0x48);
      _ZL8f_oldloc_1 = *(double *)((&DAT_017e5fc8)[(long)consoleplayer * 0x54] + 0x50);
    }
    else {
      *plVar1 = 0;
    }
  }
  return;
}

Assistant:

void AM_doFollowPlayer ()
{
	double sx, sy;

    if (players[consoleplayer].camera != NULL &&
		(f_oldloc.x != players[consoleplayer].camera->X() ||
		 f_oldloc.y != players[consoleplayer].camera->Y()))
	{
		m_x = players[consoleplayer].camera->X() - m_w/2;
		m_y = players[consoleplayer].camera->Y() - m_h/2;
		m_x2 = m_x + m_w;
		m_y2 = m_y + m_h;

  		// do the parallax parchment scrolling.
		sx = (players[consoleplayer].camera->X() - f_oldloc.x);
		sy = (f_oldloc.y - players[consoleplayer].camera->Y());
		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			AM_rotate (&sx, &sy, players[consoleplayer].camera->Angles.Yaw - 90);
		}
		AM_ScrollParchment (sx, sy);

		f_oldloc.x = players[consoleplayer].camera->X();
		f_oldloc.y = players[consoleplayer].camera->Y();
	}
}